

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lifo.h
# Opt level: O1

void __thiscall density::lifo_array<MyStruct>::~lifo_array(lifo_array<MyStruct> *this)

{
  size_t sVar1;
  LifoArrayImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  *this_00;
  MyStruct *pMVar2;
  
  pMVar2 = (this->super_LifoArrayImpl<MyStruct,_false>).m_elements;
  sVar1 = (this->super_LifoArrayImpl<MyStruct,_false>).m_size;
  if (pMVar2 <= pMVar2 + (sVar1 - 1)) {
    this_00 = &pMVar2[sVar1 - 1].m_other_strings.
               super_LifoArrayImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
    ;
    do {
      lifo_array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      destroy_elements((lifo_array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)this_00);
      detail::
      LifoArrayImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
      ::~LifoArrayImpl(this_00);
      lifo_array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      destroy_elements((lifo_array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)(this_00 + -1));
      detail::
      LifoArrayImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
      ::~LifoArrayImpl(this_00 + -1);
      pMVar2 = (MyStruct *)(this_00 + -3);
      this_00 = this_00 + -2;
    } while ((this->super_LifoArrayImpl<MyStruct,_false>).m_elements <= pMVar2);
  }
  detail::LifoArrayImpl<MyStruct,_false>::~LifoArrayImpl
            (&this->super_LifoArrayImpl<MyStruct,_false>);
  return;
}

Assistant:

~lifo_array() { destroy_elements(std::is_trivially_destructible<TYPE>()); }